

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbsvolume.cpp
# Opt level: O3

bool __thiscall ON_MorphControl::MakeRational(ON_MorphControl *this)

{
  int iVar1;
  bool bVar2;
  
  iVar1 = this->m_varient;
  if (iVar1 == 3) {
    bVar2 = ON_NurbsCage::MakeRational(&this->m_nurbs_cage);
    return bVar2;
  }
  if (iVar1 != 2) {
    if (iVar1 == 1) {
      bVar2 = ON_NurbsCurve::MakeRational(&this->m_nurbs_curve);
      return bVar2;
    }
    return false;
  }
  bVar2 = ON_NurbsSurface::MakeRational(&this->m_nurbs_surface);
  return bVar2;
}

Assistant:

bool ON_MorphControl::MakeRational()
{
  bool rc = false;
  switch(m_varient)
  {
  case 1:
    rc = m_nurbs_curve.MakeRational();
    break;
  case 2:
    rc = m_nurbs_surface.MakeRational();
    break;
  case 3:
    rc = m_nurbs_cage.MakeRational();
    break;
  }
  return rc;
}